

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spread_volatile_semantics.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::SpreadVolatileSemantics::IsTargetForVolatileSemantics
          (SpreadVolatileSemantics *this,uint32_t var_id,ExecutionModel execution_model)

{
  IRContext *this_00;
  DecorationManager *decoration_manager;
  bool bVar1;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  this_00 = (this->super_Pass).context_;
  if ((this_00->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
    IRContext::BuildDecorationManager(this_00);
  }
  decoration_manager =
       (this_00->decoration_mgr_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
       .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>._M_head_impl;
  if ((int)execution_model < 0x14c4) {
    if (execution_model == Fragment) {
      if ((((((this->super_Pass).context_)->module_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
            .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->header_).version <
          0x10600) {
        return false;
      }
      bVar1 = anon_unknown_0::HasBuiltinDecoration(decoration_manager,var_id,0x17);
      return bVar1;
    }
    if (execution_model != RayGenerationKHR) {
      if (execution_model != IntersectionKHR) {
        return false;
      }
      bVar1 = anon_unknown_0::HasBuiltinDecoration(decoration_manager,var_id,0x14ce);
      if (bVar1) {
        return true;
      }
    }
  }
  else if (2 < execution_model - ClosestHitKHR) {
    return false;
  }
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/spread_volatile_semantics.cpp:58:51)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/spread_volatile_semantics.cpp:58:51)>
             ::_M_manager;
  bVar1 = analysis::DecorationManager::FindDecoration
                    (decoration_manager,var_id,0xb,
                     (function<bool_(const_spvtools::opt::Instruction_&)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return bVar1;
}

Assistant:

bool SpreadVolatileSemantics::IsTargetForVolatileSemantics(
    uint32_t var_id, spv::ExecutionModel execution_model) {
  analysis::DecorationManager* decoration_manager =
      context()->get_decoration_mgr();
  if (execution_model == spv::ExecutionModel::Fragment) {
    return get_module()->version() >= SPV_SPIRV_VERSION_WORD(1, 6) &&
           HasBuiltinDecoration(decoration_manager, var_id,
                                uint32_t(spv::BuiltIn::HelperInvocation));
  }

  if (execution_model == spv::ExecutionModel::IntersectionKHR ||
      execution_model == spv::ExecutionModel::IntersectionNV) {
    if (HasBuiltinDecoration(decoration_manager, var_id,
                             uint32_t(spv::BuiltIn::RayTmaxKHR))) {
      return true;
    }
  }

  switch (execution_model) {
    case spv::ExecutionModel::RayGenerationKHR:
    case spv::ExecutionModel::ClosestHitKHR:
    case spv::ExecutionModel::MissKHR:
    case spv::ExecutionModel::CallableKHR:
    case spv::ExecutionModel::IntersectionKHR:
      return HasBuiltinForRayTracingVolatileSemantics(decoration_manager,
                                                      var_id);
    default:
      return false;
  }
}